

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

int messagesender_close(MESSAGE_SENDER_HANDLE message_sender)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x34c;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"messagesender_close",0x34b,1,"NULL message_sender");
    }
  }
  else {
    indicate_all_messages_as_error(message_sender);
    iVar3 = 0;
    if ((message_sender->message_sender_state & ~MESSAGE_SENDER_STATE_IDLE) ==
        MESSAGE_SENDER_STATE_OPENING) {
      set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_CLOSING);
      iVar3 = 0;
      iVar1 = link_detach(message_sender->link,true,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"messagesender_close",0x358,1,"Detaching link failed");
        }
        set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_ERROR);
        iVar3 = 0x359;
      }
    }
  }
  return iVar3;
}

Assistant:

int messagesender_close(MESSAGE_SENDER_HANDLE message_sender)
{
    int result;

    if (message_sender == NULL)
    {
        LogError("NULL message_sender");
        result = MU_FAILURE;
    }
    else
    {
        indicate_all_messages_as_error(message_sender);

        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN))
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_CLOSING);
            if (link_detach(message_sender->link, true, NULL, NULL, NULL) != 0)
            {
                LogError("Detaching link failed");
                result = MU_FAILURE;
                set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}